

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

cstr idx2::ToString<idx2::idx2_err_code>(error<idx2::idx2_err_code> *Err,bool Force)

{
  cstr __s;
  idx2_err_code iVar1;
  long lVar2;
  undefined7 in_register_00000031;
  long *in_FS_OFFSET;
  
  if (((int)CONCAT71(in_register_00000031,Force) == 0) && (Err->StrGened == true)) {
    __s = (cstr)(*in_FS_OFFSET + -0x700);
  }
  else {
    iVar1 = Err->Code;
    lVar2 = 0x10;
    do {
      if (*(idx2_err_code *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar2) == iVar1)
      goto LAB_00103aa4;
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x3b8);
    iVar1 = __Invalid__;
LAB_00103aa4:
    lVar2 = 0x10;
    while (*(idx2_err_code *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar2) != iVar1)
    {
      lVar2 = lVar2 + 0x18;
      if (lVar2 == 0x3b8) {
        __assert_fail("It != End(EnumS.NameMap)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Applications/../Core/idx2Common.h"
                      ,0x38,"stref idx2::ToString(idx2_err_code)");
      }
    }
    __s = (cstr)(*in_FS_OFFSET + -0x700);
    snprintf(__s,0x400,"%.*s (file: %s, line %d): %s",(ulong)*(uint *)(&action_s::NameMap + lVar2),
             *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar2),in_FS_OFFSET[-0x60],
             (ulong)*(uint *)(in_FS_OFFSET + -0x20),Err->Msg);
  }
  return __s;
}

Assistant:

cstr
ToString(const error<t>& Err, bool Force)
{
  if (Force || !Err.StrGened)
  {
    auto ErrStr = ToString(Err.Code);
    snprintf(ScratchBuf,
             sizeof(ScratchBuf),
             "%.*s (file: %s, line %d): %s",
             ErrStr.Size,
             ErrStr.Ptr,
             Err.Files[0],
             Err.Lines[0],
             Err.Msg);
  }
  return ScratchBuf;
}